

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::LE_EulerAngles::Encode(LE_EulerAngles *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  LE_EulerAngles *this_local;
  
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_Psi).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Theta).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_Phi).super_DataTypeBase);
  return;
}

Assistant:

void LE_EulerAngles::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_Psi
           << KDIS_STREAM m_Theta
           << KDIS_STREAM m_Phi;
}